

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcAnnotationFillAreaOccurrence::IfcAnnotationFillAreaOccurrence
          (IfcAnnotationFillAreaOccurrence *this)

{
  *(undefined ***)&this->field_0xc8 = &PTR__Object_00836880;
  *(undefined8 *)&this->field_0xd0 = 0;
  *(char **)&this->field_0xd8 = "IfcAnnotationFillAreaOccurrence";
  IfcStyledItem::IfcStyledItem((IfcStyledItem *)this,&PTR_construction_vtable_24__008eadd0);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotationFillAreaOccurrence,_2UL>).
  aux_is_derived.super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotationFillAreaOccurrence,_2UL>).
    field_0x10 = 0;
  *(undefined8 *)this = 0x8ead10;
  *(undefined8 *)&this->field_0xc8 = 0x8eadb0;
  *(undefined8 *)&this->field_0x10 = 0x8ead38;
  *(undefined8 *)&this->field_0x70 = 0x8ead60;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotationFillAreaOccurrence,_2UL>).
  _vptr_ObjectHelper = (_func_int **)0x8ead88;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotationFillAreaOccurrence,_2UL>).
  field_0x18 = 0;
  *(undefined1 **)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotationFillAreaOccurrence,_2UL>).
    field_0x20 = &this->field_0xb0;
  *(undefined8 *)&this->field_0xa8 = 0;
  this->field_0xb0 = 0;
  this->field_0xc0 = 0;
  return;
}

Assistant:

IfcAnnotationFillAreaOccurrence() : Object("IfcAnnotationFillAreaOccurrence") {}